

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::reserve
          (QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  quintptr qVar6;
  int iVar7;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar8;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar9;
  pair<QModelIndex,_QPersistentModelIndex> *data;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar10;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if ((pDVar3 != (Data *)0x0) &&
     (asize <= (pDVar3->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 5))) {
    if (((pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_0048d089;
    if ((pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_0048d089;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (pair<QModelIndex,_QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
  lVar4 = (this->d).size;
  if (asize < lVar4) {
    asize = lVar4;
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppVar8 = (pair<QModelIndex,_QPersistentModelIndex> *)
           QArrayData::allocate(&local_30,0x20,0x10,asize,KeepSize);
  local_48.d = (Data *)local_30;
  local_48.size = 0;
  lVar4 = (this->d).size;
  local_48.ptr = ppVar8;
  if (0 < lVar4) {
    ppVar10 = (this->d).ptr;
    ppVar9 = ppVar10 + lVar4;
    do {
      ppVar8[local_48.size].first.m.ptr = (ppVar10->first).m.ptr;
      iVar7 = (ppVar10->first).c;
      qVar6 = (ppVar10->first).i;
      ppVar2 = ppVar8 + local_48.size;
      (ppVar2->first).r = (ppVar10->first).r;
      (ppVar2->first).c = iVar7;
      (ppVar2->first).i = qVar6;
      QPersistentModelIndex::QPersistentModelIndex(&ppVar8[local_48.size].second,&ppVar10->second);
      local_48.size = local_48.size + 1;
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 < ppVar9);
  }
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    *(byte *)&(((ArrayOptions *)((long)local_48.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_48.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pDVar3 = (this->d).d;
  ppVar8 = (this->d).ptr;
  (this->d).d = local_48.d;
  (this->d).ptr = local_48.ptr;
  qVar5 = (this->d).size;
  (this->d).size = local_48.size;
  local_48.d = pDVar3;
  local_48.ptr = ppVar8;
  local_48.size = qVar5;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::~QArrayDataPointer(&local_48);
LAB_0048d089:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}